

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall
flatbuffers::Parser::ParseNestedFlatbuffer
          (Parser *this,Value *val,FieldDef *field,size_t fieldn,StructDef *parent_struct_def)

{
  StructDef *pSVar1;
  StructDef *pSVar2;
  bool bVar3;
  SizeT SVar4;
  char *source;
  size_t alignment;
  uint8_t *v;
  size_t in_R9;
  string local_b68;
  offset_type local_b48;
  byte local_b42;
  byte local_b41;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> off;
  bool ok;
  undefined1 local_830 [8];
  Parser nested_parser;
  string local_a8 [8];
  string substring;
  char *cursor_at_value_begin;
  string local_70 [32];
  uint local_50;
  byte local_39;
  StructDef *parent_struct_def_local;
  size_t fieldn_local;
  FieldDef *field_local;
  Value *val_local;
  Parser *this_local;
  CheckedError *ce;
  
  parent_struct_def_local = parent_struct_def;
  fieldn_local = fieldn;
  field_local = field;
  val_local = val;
  this_local = this;
  if (*(int *)&(val->type).field_0x1c == 0x5b) {
    if (((ulong)val[0x16].type.enum_def & 0x1000000) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_70,
                 "cannot parse nested_flatbuffer as bytes unless --json-nested-bytes is set",
                 (allocator<char> *)((long)&cursor_at_value_begin + 7));
      Error(this,(string *)val);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)((long)&cursor_at_value_begin + 7));
      goto LAB_00138d80;
    }
    local_39 = 0;
    ParseAnyValue(this,val,field,fieldn,parent_struct_def,in_R9,false);
    bVar3 = CheckedError::Check((CheckedError *)this);
    if (bVar3) {
      local_39 = 1;
    }
    local_50 = (uint)bVar3;
    if ((local_39 & 1) == 0) {
      CheckedError::~CheckedError((CheckedError *)this);
    }
  }
  else {
    pSVar1 = (val->type).struct_def;
    substring.field_2._M_local_buf[0xf] = '\0';
    SkipAnyJsonValue(this);
    bVar3 = CheckedError::Check((CheckedError *)this);
    if (bVar3) {
      substring.field_2._M_local_buf[0xf] = '\x01';
    }
    local_50 = (uint)bVar3;
    if ((substring.field_2._M_local_buf[0xf] & 1U) == 0) {
      CheckedError::~CheckedError((CheckedError *)this);
    }
    if (local_50 != 0) goto LAB_00138d80;
    pSVar2 = (val->type).struct_def;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>
              (local_a8,(char *)((long)&pSVar1[-1].reserved_ids.
                                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),
               (char *)((long)&pSVar2[-1].reserved_ids.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 7),
               (allocator<char> *)((long)&nested_parser.parse_depth_counter_ + 3));
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&nested_parser.parse_depth_counter_ + 3));
    IDLOptions::IDLOptions((IDLOptions *)&off);
    Parser((Parser *)local_830,(IDLOptions *)&off);
    IDLOptions::~IDLOptions((IDLOptions *)&off);
    if (*(long *)(fieldn_local + 0x120) == 0) {
      __assert_fail("field->nested_flatbuffer",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                    ,0x75e,
                    "CheckedError flatbuffers::Parser::ParseNestedFlatbuffer(Value &, FieldDef *, size_t, const StructDef *)"
                   );
    }
    nested_parser.flex_root_._8_8_ = *(undefined8 *)(fieldn_local + 0x120);
    SymbolTable<flatbuffers::EnumDef>::operator=
              ((SymbolTable<flatbuffers::EnumDef> *)
               &nested_parser.structs_.vec.
                super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (SymbolTable<flatbuffers::EnumDef> *)&val[3].type.fixed_length);
    IDLOptions::operator=
              ((IDLOptions *)
               &nested_parser.known_attributes_._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (IDLOptions *)&val[0xd].offset);
    nested_parser.opts.grpc_python_typed_handlers =
         (bool)(val[0x18].constant.field_2._M_local_buf[8] & 1);
    nested_parser.string_cache_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
         *(undefined4 *)((long)&val[0x1a].constant._M_string_length + 4);
    source = (char *)std::__cxx11::string::c_str();
    local_b41 = Parse((Parser *)local_830,source,(char **)0x0,(char *)0x0);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>_>
    ::clear((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>_>
             *)&nested_parser.structs_.vec.
                super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::clear
              ((vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_> *)
               &nested_parser.enums_.dict._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if ((local_b41 & 1) == 0) {
      local_b42 = 0;
      Error(this,(string *)val);
      bVar3 = CheckedError::Check((CheckedError *)this);
      if (bVar3) {
        local_b42 = 1;
      }
      local_50 = (uint)bVar3;
      if ((local_b42 & 1) == 0) {
        CheckedError::~CheckedError((CheckedError *)this);
      }
      if (local_50 == 0) goto LAB_00138c1f;
    }
    else {
LAB_00138c1f:
      SVar4 = FlatBufferBuilderImpl<false>::GetSize
                        ((FlatBufferBuilderImpl<false> *)((long)&nested_parser.error_.field_2 + 8));
      alignment = FlatBufferBuilderImpl<false>::GetBufferMinAlignment
                            ((FlatBufferBuilderImpl<false> *)
                             ((long)&nested_parser.error_.field_2 + 8));
      FlatBufferBuilderImpl<false>::ForceVectorAlignment
                ((FlatBufferBuilderImpl<false> *)&val[6].type.fixed_length,(ulong)SVar4,1,alignment)
      ;
      v = FlatBufferBuilderImpl<false>::GetBufferPointer
                    ((FlatBufferBuilderImpl<false> *)((long)&nested_parser.error_.field_2 + 8));
      SVar4 = FlatBufferBuilderImpl<false>::GetSize
                        ((FlatBufferBuilderImpl<false> *)((long)&nested_parser.error_.field_2 + 8));
      local_b48 = (offset_type)
                  FlatBufferBuilderImpl<false>::
                  CreateVector<unsigned_char,_flatbuffers::Offset,_flatbuffers::Vector>
                            ((FlatBufferBuilderImpl<false> *)&val[6].type.fixed_length,v,
                             (ulong)SVar4);
      NumToString<unsigned_int>(&local_b68,local_b48);
      std::__cxx11::string::operator=
                ((string *)&(field_local->super_Definition).file,(string *)&local_b68);
      std::__cxx11::string::~string((string *)&local_b68);
      local_50 = 0;
    }
    ~Parser((Parser *)local_830);
    std::__cxx11::string::~string(local_a8);
  }
  if (local_50 == 0) {
    anon_unknown_0::NoError();
  }
LAB_00138d80:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseNestedFlatbuffer(Value &val, FieldDef *field,
                                           size_t fieldn,
                                           const StructDef *parent_struct_def) {
  if (token_ == '[') {  // backwards compat for 'legacy' ubyte buffers
    if (opts.json_nested_legacy_flatbuffers) {
      ECHECK(ParseAnyValue(val, field, fieldn, parent_struct_def, 0));
    } else {
      return Error(
          "cannot parse nested_flatbuffer as bytes unless"
          " --json-nested-bytes is set");
    }
  } else {
    auto cursor_at_value_begin = cursor_;
    ECHECK(SkipAnyJsonValue());
    std::string substring(cursor_at_value_begin - 1, cursor_ - 1);

    // Create and initialize new parser
    Parser nested_parser;
    FLATBUFFERS_ASSERT(field->nested_flatbuffer);
    nested_parser.root_struct_def_ = field->nested_flatbuffer;
    nested_parser.enums_ = enums_;
    nested_parser.opts = opts;
    nested_parser.uses_flexbuffers_ = uses_flexbuffers_;
    nested_parser.parse_depth_counter_ = parse_depth_counter_;
    // Parse JSON substring into new flatbuffer builder using nested_parser
    bool ok = nested_parser.Parse(substring.c_str(), nullptr, nullptr);

    // Clean nested_parser to avoid deleting the elements in
    // the SymbolTables on destruction
    nested_parser.enums_.dict.clear();
    nested_parser.enums_.vec.clear();

    if (!ok) { ECHECK(Error(nested_parser.error_)); }
    // Force alignment for nested flatbuffer
    builder_.ForceVectorAlignment(
        nested_parser.builder_.GetSize(), sizeof(uint8_t),
        nested_parser.builder_.GetBufferMinAlignment());

    auto off = builder_.CreateVector(nested_parser.builder_.GetBufferPointer(),
                                     nested_parser.builder_.GetSize());
    val.constant = NumToString(off.o);
  }
  return NoError();
}